

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

complex dja::operator/(complex *a,complex *b)

{
  float fVar1;
  float fVar2;
  complex cVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = b->re;
  fVar2 = b->im;
  fVar4 = 1.0 / (fVar1 * fVar1 + fVar2 * fVar2);
  fVar5 = (*a).re;
  fVar6 = (*a).im;
  cVar3.im = fVar4 * (fVar1 * fVar6 + fVar5 * -fVar2);
  cVar3.re = fVar4 * (fVar1 * fVar5 + fVar6 * fVar2);
  return cVar3;
}

Assistant:

Z bar(const Z& z) {return Z(z.re, -z.im);}